

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int handle_message(sockaddr_in addr,int from_id)

{
  uint uVar1;
  _Base_ptr p_Var2;
  size_t sVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  undefined4 in_register_00000014;
  uchar auVar6 [8];
  undefined8 uVar7;
  ulong __n;
  sockaddr_in addr_00;
  string str_addr;
  char message [100000];
  undefined1 *apuStack_18708 [2];
  undefined1 auStack_186f8 [16];
  string sStack_186e8;
  char acStack_186c8 [100000];
  
  auVar6._4_4_ = in_register_00000014;
  auVar6._0_4_ = from_id;
  uVar7 = addr._0_8_;
  if (children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &children._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var5 = children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      auVar6[1] = '\0';
      auVar6[2] = '\0';
      auVar6[3] = '\0';
      auVar6[4] = '\0';
      auVar6[5] = '\0';
      auVar6[6] = '\0';
      auVar6[7] = '\0';
      auVar6[0] = (int)p_Var5[1]._M_color < from_id;
      if (from_id <= (int)p_Var5[1]._M_color) {
        p_Var2 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(long)auVar6];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != &children._M_t._M_impl.super__Rb_tree_header) &&
       ((int)p_Var2[1]._M_color <= from_id)) goto LAB_001037f7;
  }
  if (flag_root) {
    return 0;
  }
  if (id_parent != from_id) {
    return 0;
  }
LAB_001037f7:
  addr_00.sin_zero[0] = auVar6[0];
  addr_00.sin_zero[1] = auVar6[1];
  addr_00.sin_zero[2] = auVar6[2];
  addr_00.sin_zero[3] = auVar6[3];
  addr_00.sin_zero[4] = auVar6[4];
  addr_00.sin_zero[5] = auVar6[5];
  addr_00.sin_zero[6] = auVar6[6];
  addr_00.sin_zero[7] = auVar6[7];
  addr_00.sin_family = (short)uVar7;
  addr_00.sin_port = (short)((ulong)uVar7 >> 0x10);
  addr_00.sin_addr.s_addr = (int)((ulong)uVar7 >> 0x20);
  pack_address_abi_cxx11_(&sStack_186e8,addr_00);
  fprintf(_stderr,"Message from: %s\n",sStack_186e8._M_dataplus._M_p);
  uVar1 = *(uint *)((long)buf + 8);
  __n = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
  strncpy(acStack_186c8,(char *)((long)buf + 0xc),__n);
  acStack_186c8[__n] = '\0';
  fprintf(_stderr,"%s\n",acStack_186c8);
  apuStack_18708[0] = auStack_186f8;
  sVar3 = strlen(acStack_186c8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)apuStack_18708,acStack_186c8,acStack_186c8 + sVar3);
  std::__cxx11::string::operator=((string *)&tosend_message_abi_cxx11_,(string *)apuStack_18708);
  if (apuStack_18708[0] != auStack_186f8) {
    operator_delete(apuStack_18708[0]);
  }
  if ((flag_root == false) && (id_parent != from_id)) {
    fprintf(_stderr,"Vajno!!! %d %d\n",(ulong)(uint)from_id);
    fprintf(_stderr,anon_var_dwarf_12aa1,children._M_t._M_impl.super__Rb_tree_header._M_node_count);
    create_new_message(1,id_parent);
    p_Var4 = children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    handle_message();
    p_Var4 = children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  for (; (_Rb_tree_header *)p_Var4 != &children._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    if (p_Var4[1]._M_color != from_id) {
      create_new_message(1,p_Var4[1]._M_color);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_186e8._M_dataplus._M_p != &sStack_186e8.field_2) {
    operator_delete(sStack_186e8._M_dataplus._M_p);
  }
  return 1;
}

Assistant:

int handle_message(struct sockaddr_in addr, int from_id) {
    // if only on children or parent
    if (!children.count(from_id) && (flag_root || !flag_root && from_id != id_parent)) {
        return 0;
    }
    // ttl on new connector

    std::string str_addr = pack_address(addr);
    fprintf(stderr, "Message from: %s\n", str_addr.c_str());

    char message[MESSAGE_MAX_SIZE];
    size_t size_message = ntohl(((uint32_t*)buf)[2]);
    strncpy(message, (char*)buf + 3 * sizeof(int), size_message);
    message[size_message] = '\0';
    fprintf(stderr, "%s\n", message);

    tosend_message = std::string(message);
    if (!flag_root && from_id != id_parent) {
        fprintf(stderr, "Vajno!!! %d %d\n", from_id, id_parent);
        fprintf(stderr, "Сhildren size: %ld\n", children.size());
        create_new_message(MSG, id_parent);
    }
    else {
        fprintf(stderr, "No resend parent\n");
    }
    for (auto ch : children) {
        if (ch != from_id) {
            create_new_message(MSG, ch);
        }
    }
    return 1;
}